

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::PatchableProperty
          (ByteCodeWriter *this,OpCode op,RegSlot value,RegSlot instance,uint cacheId,bool isCtor,
          bool registerCacheIdForCall)

{
  Type TVar1;
  code *pcVar2;
  undefined4 cacheId_00;
  bool bVar3;
  bool bVar4;
  RegSlot RVar5;
  undefined4 *puVar6;
  FunctionBody *functionBody;
  Phase phase;
  CacheIdUnit local_4c;
  CacheIdUnit unit;
  Type local_3a;
  RegSlot local_38;
  ProfileId profileId;
  RegSlot value_local;
  OpCode op_local;
  
  unit._4_4_ = cacheId;
  local_38 = value;
  profileId = op;
  CheckOpen(this);
  CheckOp(this,profileId,(OpLayoutType)0x34);
  bVar3 = OpCodeAttr::HasMultiSizeLayout(profileId);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x82b,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar3) goto LAB_008a1953;
    *puVar6 = 0;
  }
  RVar5 = local_38;
  if (local_38 != 0xffffffff) {
    if (this->m_functionWrite == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar3) goto LAB_008a1953;
      *puVar6 = 0;
    }
    local_38 = FunctionBody::MapRegSlot(this->m_functionWrite,RVar5);
    if (instance != 0xffffffff) {
      if (this->m_functionWrite == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (!bVar3) goto LAB_008a1953;
        *puVar6 = 0;
      }
      RVar5 = FunctionBody::MapRegSlot(this->m_functionWrite,instance);
      local_3a = 0xffff;
      bVar3 = false;
      if (profileId < 0x68) {
        if (profileId < 0x5e) {
          if (((profileId == 0x53) || (profileId == 0x55)) || (profileId == 0x57))
          goto LAB_008a1814;
        }
        else if (((profileId == 0x5e) || (profileId == 0x60)) || (profileId == 0x66)) {
          if (isCtor && registerCacheIdForCall) {
            local_4c.cacheId = unit._4_4_;
            local_4c._4_4_ = (uint)(uint3)local_4c._5_3_ << 8;
            bVar3 = JsUtil::
                    BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    ::TryGetValue<unsigned_int>
                              (this->callRegToLdFldCacheIndexMap,&local_38,&local_4c);
            if (bVar3) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar6 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                          ,0x84d,
                                          "(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit))"
                                          ,"!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit)"
                                         );
              if (!bVar3) goto LAB_008a1953;
              *puVar6 = 0;
            }
            JsUtil::
            BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::
            Insert<(JsUtil::BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                      ((BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)this->callRegToLdFldCacheIndexMap,&local_38,&local_4c);
          }
          goto LAB_008a160a;
        }
LAB_008a18a8:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x873,"(false)",
                                    "The specified OpCode is not intended for patchable field-access"
                                   );
        if (!bVar3) goto LAB_008a1953;
        *puVar6 = 0;
      }
      else if (profileId < 0x76) {
        if (profileId == 0x68) {
LAB_008a160a:
          bVar3 = DynamicProfileInfo::IsEnabled(AggressiveIntTypeSpecPhase,this->m_functionWrite);
          if (((!bVar3) &&
              (bVar3 = DynamicProfileInfo::IsEnabled(FloatTypeSpecPhase,this->m_functionWrite),
              !bVar3)) &&
             ((bVar3 = DynamicProfileInfo::IsEnabled(ObjTypeSpecPhase,this->m_functionWrite), !bVar3
              && (bVar3 = DoDynamicProfileOpcode(this,InlinePhase,false), !bVar3)))) {
            functionBody = this->m_functionWrite;
            phase = ProfileBasedFldFastPathPhase;
            goto LAB_008a17ff;
          }
        }
        else {
          if (profileId == 0x6c) {
            if (registerCacheIdForCall) {
              local_4c.cacheId = unit._4_4_;
              local_4c._4_4_ = (uint)(uint3)local_4c._5_3_ << 8;
              bVar3 = JsUtil::
                      BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      ::TryGetValue<unsigned_int>
                                (this->callRegToLdFldCacheIndexMap,&local_38,&local_4c);
              if (bVar3) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                *puVar6 = 1;
                bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                            ,0x85f,
                                            "(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit))"
                                            ,
                                            "!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit)"
                                           );
                if (!bVar3) goto LAB_008a1953;
                *puVar6 = 0;
              }
              JsUtil::
              BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::
              Insert<(JsUtil::BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                        ((BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)this->callRegToLdFldCacheIndexMap,&local_38,&local_4c);
            }
          }
          else if (profileId != 0x70) goto LAB_008a18a8;
LAB_008a17d1:
          bVar3 = DynamicProfileInfo::IsEnabled(ProfileBasedFldFastPathPhase,this->m_functionWrite);
          if ((!bVar3) && (bVar3 = DoDynamicProfileOpcode(this,InlinePhase,false), !bVar3)) {
            functionBody = this->m_functionWrite;
            phase = ObjTypeSpecPhase;
LAB_008a17ff:
            bVar3 = DynamicProfileInfo::IsEnabled(phase,functionBody);
            if (!bVar3) goto LAB_008a1811;
          }
        }
        OpCodeUtil::ConvertNonCallOpToProfiled(&profileId);
      }
      else {
        if (profileId < 0x85) {
          if ((profileId == 0x76) || (profileId == 0x7a)) goto LAB_008a17d1;
          goto LAB_008a18a8;
        }
        if (profileId == 0x85) goto LAB_008a1814;
        if (profileId != 0xa6) goto LAB_008a18a8;
        bVar3 = DynamicProfileInfo::IsEnabled(AggressiveIntTypeSpecPhase,this->m_functionWrite);
        if (((((bVar3) ||
              (bVar3 = DynamicProfileInfo::IsEnabled(FloatTypeSpecPhase,this->m_functionWrite),
              bVar3)) ||
             (bVar3 = DynamicProfileInfo::IsEnabled(TypedArrayTypeSpecPhase,this->m_functionWrite),
             bVar3)) ||
            ((bVar3 = DynamicProfileInfo::IsEnabled(ArrayCheckHoistPhase,this->m_functionWrite),
             bVar3 || (bVar3 = DynamicProfileInfo::IsEnabled(ObjTypeSpecPhase,this->m_functionWrite)
                      , bVar3)))) ||
           ((bVar3 = DoDynamicProfileOpcode(this,InlinePhase,false), bVar3 ||
            (bVar3 = DynamicProfileInfo::IsEnabled
                               (ProfileBasedFldFastPathPhase,this->m_functionWrite), bVar3)))) {
          TVar1 = this->m_functionWrite->profiledLdLenCount;
          if (TVar1 != 0xffff) {
            this->m_functionWrite->profiledLdLenCount = TVar1 + 1;
            local_3a = TVar1;
            OpCodeUtil::ConvertNonCallOpToProfiled(&profileId);
            bVar3 = true;
            goto LAB_008a1814;
          }
        }
      }
LAB_008a1811:
      bVar3 = false;
LAB_008a1814:
      cacheId_00 = unit._4_4_;
      bVar4 = TryWriteElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                        (this,profileId,local_38,RVar5,unit._4_4_);
      if ((!bVar4) &&
         (bVar4 = TryWriteElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                            (this,profileId,local_38,RVar5,cacheId_00), !bVar4)) {
        local_4c.cacheId = local_38;
        unit.cacheId = cacheId_00;
        local_4c._4_4_ = RVar5;
        Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,profileId,this);
        Data::Write(&this->m_byteCodeData,&local_4c,0xc);
      }
      if (bVar3) {
        Data::Write(&this->m_byteCodeData,&local_3a,2);
      }
      return;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar6 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar3) {
    *puVar6 = 0;
    Throw::InternalError();
  }
LAB_008a1953:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void ByteCodeWriter::PatchableProperty(OpCode op, RegSlot value, RegSlot instance, uint cacheId, bool isCtor, bool registerCacheIdForCall)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementCP);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);
        instance = ConsumeReg(instance);

        bool isProfiled = false;
        Js::ProfileId profileId = Js::Constants::NoProfileId;

        switch (op)
        {
        case OpCode::LdLen_A:
        {
            if ((DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) ||
                DoDynamicProfileOpcode(FloatTypeSpecPhase) ||
                DoDynamicProfileOpcode(TypedArrayTypeSpecPhase) ||
                DoDynamicProfileOpcode(ArrayCheckHoistPhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase))
                && this->m_functionWrite->AllocProfiledLdLenId(&profileId))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
                isProfiled = true;
            }
            break;
        }
        case OpCode::LdFldForTypeOf:
        case OpCode::LdFld:
        case OpCode::LdFld_ReuseLoc:
            if (isCtor) // The symbol loaded by this LdFld will be used as a constructor
            {
                if (registerCacheIdForCall)
                {
                    CacheIdUnit unit(cacheId);
                    Assert(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit));
                    callRegToLdFldCacheIndexMap->Add(value, unit);
                }
            }
        case OpCode::LdFldForCallApplyTarget:
            if (DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) ||
                DoDynamicProfileOpcode(FloatTypeSpecPhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            break;
        case OpCode::LdMethodFld:
            if (registerCacheIdForCall)
            {
                CacheIdUnit unit(cacheId);
                Assert(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit));
                callRegToLdFldCacheIndexMap->Add(value, unit);
            }
            // fall-through
        case OpCode::StFld:
        case OpCode::StFldStrict:
        case OpCode::InitFld:
            if (DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            break;
        case OpCode::InitLetFld:
        case OpCode::InitConstFld:
        case OpCode::InitClassMember:
        case OpCode::ScopedLdMethodFld:
            break;
        default:
            AssertMsg(false, "The specified OpCode is not intended for patchable field-access");
            break;
        }

        MULTISIZE_LAYOUT_WRITE(ElementCP, op, value, instance, cacheId);

        if (isProfiled)
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }